

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O1

void __thiscall SmallVector_CtorCopy2_Test::TestBody(SmallVector_CtorCopy2_Test *this)

{
  char *pcVar1;
  initializer_list<int> init;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  small_vector<int,_3UL> c;
  small_vector<int,_3UL> b;
  AssertHelper local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_88;
  undefined4 local_80;
  small_vector<int,_3UL> local_78;
  small_vector<int,_3UL> local_40;
  
  local_78.elements_ = (size_t)&DAT_500000003;
  local_78.small_buffer_._M_elems[0] = 7;
  local_78.small_buffer_._M_elems[1] = 0xb;
  local_78.small_buffer_._M_elems[2] = 0xd;
  init._M_len = 5;
  init._M_array = (iterator)&local_78;
  pstore::small_vector<int,_3UL>::small_vector(&local_40,init);
  pstore::small_vector<int,_3UL>::small_vector(&local_78,&local_40);
  local_a8.data_._0_4_ = 5;
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78.elements_
  ;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_90,"5U","c.size ()",(uint *)&local_a8,(unsigned_long *)&local_a0);
  if (local_90._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (pbStack_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (pbStack_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_88,pbStack_88);
  }
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb0000000d;
  pbStack_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_500000007;
  local_80 = 3;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int>>>
  ::operator()(&local_a0,(char *)&local_90,(small_vector<int,_3UL> *)0x204375);
  if ((char)local_a0._M_head_impl == '\0') {
    testing::Message::Message((Message *)&local_90);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x4b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  if (local_78.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_40.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.big_buffer_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST (SmallVector, CtorCopy2) {
    pstore::small_vector<int, 3> const b{3, 5, 7, 11, 13};
    pstore::small_vector<int, 3> c = b;
    EXPECT_EQ (5U, c.size ());
    EXPECT_THAT (c, ::testing::ElementsAre (3, 5, 7, 11, 13));
}